

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O2

FeatureOptions<wasm::Type::BasicType> * __thiscall
wasm::Random::FeatureOptions<wasm::Type::BasicType>::add<wasm::Type::BasicType>
          (FeatureOptions<wasm::Type::BasicType> *this,FeatureSet feature,BasicType option,
          BasicType rest)

{
  mapped_type *this_00;
  FeatureOptions<wasm::Type::BasicType> *pFVar1;
  key_type local_30;
  BasicType local_2c;
  FeatureSet feature_local;
  BasicType option_local;
  
  local_30.features = feature.features;
  local_2c = option;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>_>_>_>
            ::operator[](&this->options,&local_30);
  std::vector<wasm::Type::BasicType,_std::allocator<wasm::Type::BasicType>_>::push_back
            (this_00,&local_2c);
  pFVar1 = add<>(this,(FeatureSet)local_30.features,rest);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }